

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPSession::SendRawData(RTPSession *this,void *data,size_t len,bool usertpchannel)

{
  int iVar1;
  
  if (this->created == true) {
    iVar1 = (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject
              [(ulong)!usertpchannel * 2 + 0xd])();
    return iVar1;
  }
  return -0x3e;
}

Assistant:

int RTPSession::SendRawData(const void *data, size_t len, bool usertpchannel)
{
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	int status;

	if (usertpchannel)
		status = rtptrans->SendRTPData(data, len);
	else
		status = rtptrans->SendRTCPData(data, len);
	return status;
}